

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_auth_act(connectdata *conn)

{
  Curl_HttpReq CVar1;
  Curl_easy *data;
  _Bool _Var2;
  _Bool _Var3;
  CURLcode CVar4;
  int iVar5;
  char *pcVar6;
  
  data = conn->data;
  iVar5 = (data->req).httpcode;
  if (iVar5 - 100U < 100) {
    return CURLE_OK;
  }
  if ((data->state).authproblem == true) {
    if ((data->set).http_fail_on_error == false) {
      return CURLE_OK;
    }
    return CURLE_HTTP_RETURNED_ERROR;
  }
  if ((conn->bits).user_passwd == true) {
    if (iVar5 != 0x191) {
      _Var2 = false;
      if ((299 < iVar5) || (_Var2 = false, (conn->bits).authneg == false)) goto LAB_00111396;
    }
    _Var2 = pickoneauth(&(data->state).authhost);
    if (!_Var2) {
      (data->state).authproblem = true;
    }
  }
  else {
    _Var2 = false;
  }
LAB_00111396:
  if ((conn->bits).proxy_user_passwd == true) {
    iVar5 = (data->req).httpcode;
    if (iVar5 != 0x197) {
      _Var3 = false;
      if ((299 < iVar5) || (_Var3 = false, (conn->bits).authneg == false)) goto LAB_001113e0;
    }
    _Var3 = pickoneauth(&(data->state).authproxy);
    if (!_Var3) {
      (data->state).authproblem = true;
    }
  }
  else {
    _Var3 = false;
  }
LAB_001113e0:
  if ((_Var2 | _Var3) == 1) {
    if (_Var2 != false) {
      Curl_http_input_auth_init_ctx(conn,false);
    }
    if (_Var3 != false) {
      Curl_http_input_auth_init_ctx(conn,true);
    }
    (*Curl_cfree)((data->req).newurl);
    (data->req).newurl = (char *)0x0;
    pcVar6 = (*Curl_cstrdup)((data->change).url);
    (data->req).newurl = pcVar6;
    if (pcVar6 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar1 = (data->set).httpreq;
    if (((CVar1 != HTTPREQ_GET) && (CVar1 != HTTPREQ_HEAD)) &&
       (((conn->bits).rewindaftersend == false &&
        (CVar4 = http_perhapsrewind(conn), CVar4 != CURLE_OK)))) {
      return CVar4;
    }
  }
  else if (((((data->req).httpcode < 300) && ((data->state).authhost.done == false)) &&
           ((conn->bits).authneg == true)) &&
          ((CVar1 = (data->set).httpreq, CVar1 != HTTPREQ_GET && (CVar1 != HTTPREQ_HEAD)))) {
    pcVar6 = (*Curl_cstrdup)((data->change).url);
    (data->req).newurl = pcVar6;
    if (pcVar6 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (data->state).authhost.done = true;
  }
  iVar5 = http_should_fail(conn);
  if (iVar5 == 0) {
    return CURLE_OK;
  }
  Curl_failf(data,"The requested URL returned error: %d",(ulong)(uint)(data->req).httpcode);
  return CURLE_HTTP_RETURNED_ERROR;
}

Assistant:

CURLcode Curl_http_auth_act(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  bool pickhost = FALSE;
  bool pickproxy = FALSE;
  CURLcode result = CURLE_OK;

  if(100 <= data->req.httpcode && 199 >= data->req.httpcode)
    /* this is a transient response code, ignore */
    return CURLE_OK;

  if(data->state.authproblem)
    return data->set.http_fail_on_error?CURLE_HTTP_RETURNED_ERROR:CURLE_OK;

  if(conn->bits.user_passwd &&
     ((data->req.httpcode == 401) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickhost = pickoneauth(&data->state.authhost);
    if(!pickhost)
      data->state.authproblem = TRUE;
  }
  if(conn->bits.proxy_user_passwd &&
     ((data->req.httpcode == 407) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickproxy = pickoneauth(&data->state.authproxy);
    if(!pickproxy)
      data->state.authproblem = TRUE;
  }

  if(pickhost || pickproxy) {
    if(pickhost)
      Curl_http_input_auth_init_ctx(conn, false);
    if(pickproxy)
      Curl_http_input_auth_init_ctx(conn, true);

    /* In case this is GSS auth, the newurl field is already allocated so
       we must make sure to free it before allocating a new one. As figured
       out in bug #2284386 */
    Curl_safefree(data->req.newurl);
    data->req.newurl = strdup(data->change.url); /* clone URL */
    if(!data->req.newurl)
      return CURLE_OUT_OF_MEMORY;

    if((data->set.httpreq != HTTPREQ_GET) &&
       (data->set.httpreq != HTTPREQ_HEAD) &&
       !conn->bits.rewindaftersend) {
      result = http_perhapsrewind(conn);
      if(result)
        return result;
    }
  }
  else if((data->req.httpcode < 300) &&
          (!data->state.authhost.done) &&
          conn->bits.authneg) {
    /* no (known) authentication available,
       authentication is not "done" yet and
       no authentication seems to be required and
       we didn't try HEAD or GET */
    if((data->set.httpreq != HTTPREQ_GET) &&
       (data->set.httpreq != HTTPREQ_HEAD)) {
      data->req.newurl = strdup(data->change.url); /* clone URL */
      if(!data->req.newurl)
        return CURLE_OUT_OF_MEMORY;
      data->state.authhost.done = TRUE;
    }
  }
  if(http_should_fail(conn)) {
    failf(data, "The requested URL returned error: %d",
          data->req.httpcode);
    result = CURLE_HTTP_RETURNED_ERROR;
  }

  return result;
}